

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmldivs.cpp
# Opt level: O1

div_t __thiscall HtmlDivs::div(HtmlDivs *this,int __numer,int __denom)

{
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  QString *line;
  QByteArrayView QVar1;
  HtmlDivs divs;
  QArrayDataPointer<QString> local_88;
  QArrayData *local_70;
  undefined8 *local_68;
  HtmlDivs local_58;
  
  line = (QString *)CONCAT44(in_register_00000034,__numer);
  local_58.mBackgroundColor.d.d = (Data *)0x0;
  local_58.mBackgroundColor.d.ptr = (char16_t *)0x0;
  local_58.mDivs.d.ptr = (QString *)0x0;
  local_58.mDivs.d.size = 0;
  local_58.mLines.d.size = 0;
  local_58.mDivs.d.d = (Data *)0x0;
  local_58.mLines.d.d = (Data *)0x0;
  local_58.mLines.d.ptr = (QString *)0x0;
  local_58.mBackgroundColor.d.size = 0;
  append(&local_58,line,(QString *)CONCAT44(in_register_00000014,__denom));
  close(&local_58,(int)line);
  local_88.d = local_58.mDivs.d.d;
  local_88.ptr = local_58.mDivs.d.ptr;
  local_88.size = local_58.mDivs.d.size;
  if (local_58.mDivs.d.d != (Data *)0x0) {
    LOCK();
    ((local_58.mDivs.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.mDivs.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar1.m_data = (storage_type *)0x0;
  QVar1.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar1);
  if (local_68 == (undefined8 *)0x0) {
    local_68 = &QString::_empty;
  }
  QtPrivate::QStringList_join((QList *)this,(QChar *)&local_88,(longlong)local_68);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  if (&(local_58.mBackgroundColor.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.mBackgroundColor.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_58.mBackgroundColor.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.mBackgroundColor.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_58.mBackgroundColor.d.d)->super_QArrayData,2,8);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58.mDivs.d);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_58);
  return (div_t)this;
}

Assistant:

QString HtmlDivs::div(const QString &text, const QString &backgroundColor)
{
    HtmlDivs divs;
    divs.append(text, backgroundColor);
    divs.close();
    return divs.divs().join("");
}